

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  Enum EVar1;
  Result local_24;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator=
            (&s_stdout_stream,
             (unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::~unique_ptr
            ((unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
             &stack0xffffffffffffffe0);
  ParseOptions(argc,argv);
  local_24 = ReadAndRunModule(s_infile);
  EVar1 = wabt::Result::operator_cast_to_Enum(&local_24);
  return (int)(EVar1 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();

  ParseOptions(argc, argv);

  wabt::Result result = ReadAndRunModule(s_infile);
  return result != wabt::Result::Ok;
}